

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void ParseEntity(TidyDocImpl *doc,GetTokenMode mode)

{
  uint *puVar1;
  Lexer *lexer;
  uint c;
  int iVar2;
  Bool BVar3;
  Bool BVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong extraout_RAX;
  void *pvVar9;
  char cVar10;
  undefined8 extraout_RDX;
  ulong uVar11;
  GetTokenMode GVar12;
  char *pcVar13;
  long lVar14;
  uint uVar15;
  uint ch;
  tchar local_8c;
  void *local_88;
  uint local_7c;
  uint local_78;
  GetTokenMode local_74;
  undefined4 local_70;
  uint entver;
  TidyDocImpl *local_68;
  Bool local_60;
  int local_5c;
  uint local_58;
  uint local_54;
  Lexer *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar8;
  
  local_88 = (void *)(ulong)*(uint *)((doc->config).value + 0x40);
  local_68 = (TidyDocImpl *)CONCAT44(local_68._4_4_,*(undefined4 *)((doc->config).value + 0x67));
  entver = 0;
  lexer = doc->lexer;
  local_38 = (ulong)lexer->lexsize;
  local_78 = lexer->lexsize - 1;
  local_54 = doc->docIn->curcol - 1;
  uVar6 = 0;
  local_74 = mode;
LAB_00142193:
  uVar15 = uVar6;
  do {
    c = prvTidyReadChar(doc->docIn);
    uVar8 = (ulong)c;
    if (c == 0xffffffff) {
LAB_00142265:
      local_70 = (undefined4)CONCAT71((int7)(uVar8 >> 8),1);
LAB_0014226b:
      uVar6 = local_78;
      lexer->lexbuf[lexer->lexsize] = '\0';
      uVar8 = (ulong)local_78;
      iVar2 = prvTidytmbstrcmp(lexer->lexbuf + uVar8,"&apos");
      if ((((iVar2 == 0) && (*(int *)((doc->config).value + 100) == 0)) && (lexer->isvoyager == no))
         && ((*(int *)((doc->config).value + 0x62) == 0 &&
             (iVar2 = prvTidyHTMLVersion(doc), iVar2 != 0x20000)))) {
        prvTidyReportEntityError(doc,0x225,lexer->lexbuf + uVar8,0x27);
      }
      GVar12 = local_74;
      if (c == 0x3b && local_74 == OtherNamespace) {
        ch = 0xff;
        entver = 0x60000;
        cVar10 = '\0';
        goto LAB_001426e2;
      }
      BVar3 = prvTidyEntityInfo(lexer->lexbuf + uVar8,(Bool)local_68,&ch,&entver);
      uVar11 = CONCAT71((int7)((ulong)extraout_RDX >> 8),local_88 == (void *)0x0);
      if ((local_88 != (void *)0x0) || (BVar3 == no)) goto LAB_00142640;
      local_58 = (uint)uVar11;
      BVar4 = prvTidyIsLowSurrogate(ch);
      if (BVar4 == no) {
        BVar3 = prvTidyIsHighSurrogate(ch);
        uVar6 = local_78;
        cVar10 = (char)local_58;
        if (BVar3 != no) {
          prvTidyReportSurrogateError(doc,0x22e,ch,0);
          ch = 0xfffd;
          cVar10 = '\x01';
        }
        goto LAB_001426e2;
      }
      uVar5 = prvTidyReadChar(doc->docIn);
      uVar7 = ch;
      if (uVar5 != 0x26) {
        prvTidyUngetChar(uVar5,doc->docIn);
        prvTidyReportSurrogateError(doc,0x230,ch,0);
        ch = 0xfffd;
        goto LAB_001426dd;
      }
      local_50 = doc->lexer;
      local_8c = 0;
      local_48 = uVar8;
      if ((local_50 == (Lexer *)0x0) ||
         (pvVar9 = (*local_50->allocator->vtbl->realloc)(local_50->allocator,(void *)0x0,0x20),
         uVar8 = local_48, pvVar9 == (void *)0x0)) goto LAB_001426b2;
      local_7c = uVar7;
      local_40 = 0x20;
      uVar6 = 0;
      local_88 = pvVar9;
      local_60 = BVar3;
      iVar2 = 0;
      goto LAB_001423c8;
    }
    if (c == 0x3b) {
      local_70 = 0;
      goto LAB_0014226b;
    }
    if (c == 0x23 && uVar15 == 0) {
      if (*(int *)((doc->config).value + 0x38) != 0) {
        c = 0x23;
        uVar6 = 1;
        if (((doc->config).value[0x22].v & 0xfffffffffffffffe) != 0xc) goto LAB_0014223c;
      }
      prvTidyUngetChar(0x23,doc->docIn);
      return;
    }
    if (uVar15 == 1 && uVar6 == 1) {
      if ((c == 0x78) || (c == 0x58 && (Bool)local_68 == 0)) break;
    }
    iVar2 = (*(code *)(&PTR_prvTidyIsNamechar_001d56b0)[uVar6])(c);
    if (iVar2 == 0) {
      prvTidyUngetChar(c,doc->docIn);
      uVar8 = extraout_RAX;
      goto LAB_00142265;
    }
    prvTidyAddCharToLexer(lexer,c);
    uVar15 = uVar15 + 1;
  } while( true );
  uVar6 = 2;
LAB_0014223c:
  prvTidyAddCharToLexer(lexer,c);
  goto LAB_00142193;
  while (uVar6 = 1, iVar2 = local_5c, uVar5 == 0x23) {
LAB_001423c8:
    local_5c = iVar2;
    uVar15 = uVar6;
    uVar11 = (ulong)uVar15;
    uVar5 = prvTidyReadChar(doc->docIn);
    if ((uVar5 == 0xffffffff) || (uVar5 == 0x3b)) goto LAB_00142571;
    if ((uint)local_40 < uVar15 + 2) {
      local_40 = (ulong)((uint)local_40 * 2);
      local_88 = (*local_50->allocator->vtbl->realloc)(local_50->allocator,local_88,local_40);
      if (local_88 == (void *)0x0) {
        local_88 = (void *)0x0;
        goto LAB_00142571;
      }
    }
    *(char *)((long)local_88 + uVar11) = (char)uVar5;
    if (uVar15 != 0) {
      uVar6 = uVar15 + 1;
      if (uVar15 == 1) {
        iVar2 = 1;
        if ((uVar5 == 0x78) || (iVar2 = 1, uVar5 == 0x58 && (Bool)local_68 == 0)) goto LAB_001423c8;
      }
      uVar7 = local_7c;
      if (local_5c == 0) {
        if (uVar5 < 0x80) {
          iVar2 = 0;
          if ((lexmap[uVar5] & 1) == 0) {
            uVar15 = uVar15 + 1;
            if (uVar5 != 0x3b) goto LAB_0014265a;
            *(undefined1 *)((long)local_88 + (ulong)uVar15) = 0;
            goto LAB_0014259e;
          }
          goto LAB_001423c8;
        }
      }
      else if (uVar5 < 0x80) {
        iVar2 = 1;
        if ((lexmap[uVar5] & 0x80) == 0) {
          uVar11 = (ulong)(uVar15 + 1);
          goto LAB_00142571;
        }
        goto LAB_001423c8;
      }
      uVar15 = uVar15 + 1;
      goto LAB_0014265a;
    }
  }
  uVar11 = 1;
LAB_00142571:
  uVar15 = (uint)uVar11;
  uVar7 = local_7c;
  if (uVar5 == 0x3b) {
    *(undefined1 *)((long)local_88 + uVar11) = 0;
    if (local_5c == 0) {
LAB_0014259e:
      lVar14 = (long)local_88 + 1;
      pcVar13 = "%d";
    }
    else {
      lVar14 = (long)local_88 + 2;
      pcVar13 = "%x";
    }
    uVar7 = local_7c;
    iVar2 = __isoc99_sscanf(lVar14,pcVar13,&local_8c);
    if ((iVar2 != 1) || (BVar3 = prvTidyIsHighSurrogate(local_8c), BVar3 == no)) {
      prvTidyUngetChar(0x3b,doc->docIn);
      goto LAB_0014265a;
    }
    local_8c = prvTidyCombineSurrogatePair(local_8c,uVar7);
    BVar3 = prvTidyIsValidCombinedChar(local_8c);
    if (BVar3 == no) {
      ch = 0xfffd;
      prvTidyReportSurrogateError(doc,0x22f,uVar7,local_8c);
    }
    else {
      ch = local_8c;
    }
    BVar3 = local_60;
    GVar12 = local_74;
    (*local_50->allocator->vtbl->free)(local_50->allocator,local_88);
    uVar11 = (ulong)local_58;
LAB_00142640:
    cVar10 = (char)uVar11;
    uVar6 = local_78;
    if (BVar3 == no) goto LAB_0014270a;
  }
  else {
LAB_0014265a:
    pvVar9 = local_88;
    if ((local_88 == (void *)0x0) || (uVar15 == 0)) {
      if (local_88 != (void *)0x0) goto LAB_0014269d;
    }
    else {
      while (uVar15 = uVar15 - 1, -1 < (int)uVar15) {
        prvTidyUngetChar((int)*(char *)((long)pvVar9 + (ulong)(uVar15 & 0x7fffffff)),doc->docIn);
      }
LAB_0014269d:
      (*local_50->allocator->vtbl->free)(local_50->allocator,pvVar9);
    }
LAB_001426b2:
    prvTidyReportSurrogateError(doc,0x230,uVar7,0);
    prvTidyUngetChar(0x26,doc->docIn);
    uVar8 = local_48;
    GVar12 = local_74;
LAB_001426dd:
    cVar10 = '\x01';
    uVar6 = local_78;
  }
LAB_001426e2:
  if (((ch & 0xffffffe0) != 0x80) && (c == 0x3b || ch < 0x100)) {
    if (c != 0x3b) {
      lexer->lines = doc->docIn->curline;
      lexer->columns = local_54;
      local_68 = doc;
      prvTidyReportEntityError(doc,0x260,lexer->lexbuf + uVar8,c);
      doc = local_68;
    }
    if (cVar10 == '\0') {
      prvTidyAddCharToLexer(lexer,0x3b);
    }
    else {
      lexer->lexsize = uVar6;
      if (GVar12 == Preformatted && ch == 0xa0) {
        ch = 0x20;
      }
      prvTidyAddCharToLexer(lexer,ch);
      if ((ch == 0x26) && (*(int *)((doc->config).value + 0x45) == 0)) {
        AddStringToLexer(lexer,anon_var_dwarf_5294e + 0x2b);
      }
    }
    puVar1 = &doc->lexer->versions;
    *puVar1 = *puVar1 & (entver | 0xe000);
    return;
  }
LAB_0014270a:
  lexer->lines = doc->docIn->curline;
  lexer->columns = local_54;
  if ((uint)local_38 < lexer->lexsize) {
    if ((ch & 0xffffffe0) == 0x80) {
      uVar7 = prvTidyDecodeWin1252(ch);
      if (c != 0x3b) {
        prvTidyReportEntityError(doc,0x25f,lexer->lexbuf + uVar8,c);
      }
      prvTidyReportEncodingError(doc,0x249,ch,(uint)(uVar7 == 0));
      lexer->lexsize = uVar6;
      if (uVar7 == 0) {
        return;
      }
    }
    else {
      prvTidyReportEntityError(doc,0x28d,lexer->lexbuf + uVar8,ch);
      if ((char)local_70 != '\0') {
        return;
      }
      uVar7 = 0x3b;
    }
    prvTidyAddCharToLexer(lexer,uVar7);
  }
  else {
    iVar2 = prvTidyHTMLVersion(doc);
    if (iVar2 != 0x20000) {
      prvTidyReportEntityError(doc,0x282,lexer->lexbuf + uVar8,ch);
    }
  }
  return;
}

Assistant:

static void ParseEntity( TidyDocImpl* doc, GetTokenMode mode )
{
    typedef enum
    {
        ENT_default,
        ENT_numdec,
        ENT_numhex
    } ENTState;
    
    typedef Bool (*ENTfn)(uint);
    const ENTfn entFn[] = {
        TY_(IsNamechar),
        TY_(IsDigit),
        IsDigitHex
    };
    uint start;
    ENTState entState = ENT_default;
    uint charRead = 0;
    Bool semicolon = no, found = no;
    Bool isXml = cfgBool( doc, TidyXmlTags );
    Bool preserveEntities = cfgBool( doc, TidyPreserveEntities );
    uint c, ch, startcol, entver = 0;
    Lexer* lexer = doc->lexer;

    start = lexer->lexsize - 1;  /* to start at "&" */
    startcol = doc->docIn->curcol - 1;

    while ( (c = TY_(ReadChar)(doc->docIn)) != EndOfStream )
    {
        if ( c == ';' )
        {
            semicolon = yes;
            break;
        }
        ++charRead;

        if (charRead == 1 && c == '#')
        {
            if ( !cfgBool(doc, TidyNCR) ||
                 cfg(doc, TidyInCharEncoding) == BIG5 ||
                 cfg(doc, TidyInCharEncoding) == SHIFTJIS )
            {
                TY_(UngetChar)('#', doc->docIn);
                return;
            }

            TY_(AddCharToLexer)( lexer, c );
            entState = ENT_numdec;
            continue;
        }
        else if (charRead == 2 && entState == ENT_numdec
                 && (c == 'x' || (!isXml && c == 'X')) )
        {
            TY_(AddCharToLexer)( lexer, c );
            entState = ENT_numhex;
            continue;
        }

        if ( entFn[entState](c) )
        {
            TY_(AddCharToLexer)( lexer, c );
            continue;
        }

        /* otherwise put it back */
        TY_(UngetChar)( c, doc->docIn );
        break;
    }

    /* make sure entity is NULL terminated */
    lexer->lexbuf[lexer->lexsize] = '\0';

    /* Should contrain version to XML/XHTML if &apos; 
    ** is encountered.  But this is not possible with
    ** Tidy's content model bit mask.
    */
    if ( TY_(tmbstrcmp)(lexer->lexbuf+start, "&apos") == 0
         && !cfgBool(doc, TidyXmlOut)
         && !lexer->isvoyager
         && !cfgBool(doc, TidyXhtmlOut)
         && !(TY_(HTMLVersion)(doc) == HT50) ) /* Issue #239 - no warning if in HTML5++ mode */
        TY_(ReportEntityError)( doc, APOS_UNDEFINED, lexer->lexbuf+start, 39 );

    if (( mode == OtherNamespace ) && ( c == ';' ))
    {
        /* #130 MathML attr and entity fix! */
        found = yes;
        ch = 255;
        entver = XH50|HT50;
        preserveEntities = yes;
    }
    else
    {
        /* Lookup entity code and version
        */
        found = TY_(EntityInfo)( lexer->lexbuf+start, isXml, &ch, &entver );
    }

    /* Issue #483 - Deal with 'surrogate pairs' */
    /* TODO: Maybe warning/error, like found a leading surrogate
       but no following surrogate! Maybe should avoid outputting
       invalid utf-8 for this entity - maybe substitute?  */
    if (!preserveEntities && found && TY_(IsLowSurrogate)(ch))
    {
        uint c1;
        if ((c1 = TY_(ReadChar)(doc->docIn)) == '&')
        {
            SPStatus status;
            /* Have a following entity, 
               so there is a chance of having a valid surrogate pair */
            c1 = ch;    /* keep first value, in case of error */
            status = GetSurrogatePair(doc, isXml, &ch);
            if (status == SP_error)
            {
                TY_(ReportSurrogateError)(doc, BAD_SURROGATE_TAIL, c1, 0); /* SP WARNING: - using substitute character */
                TY_(UngetChar)('&', doc->docIn);  /* otherwise put it back */
            }
        }
        else
        {
            /* put this non-entity lead char back */
            TY_(UngetChar)(c1, doc->docIn);
            /* Have leading surrogate pair, with no tail */
            TY_(ReportSurrogateError)(doc, BAD_SURROGATE_TAIL, ch, 0); /* SP WARNING: - using substitute character */
            ch = 0xFFFD;
        }
    } 
    else if (!preserveEntities && found && TY_(IsHighSurrogate)(ch))
    {
        /* Have trailing surrogate pair, with no lead */
        TY_(ReportSurrogateError)(doc, BAD_SURROGATE_LEAD, ch, 0); /* SP WARNING: - using substitute character */
        ch = 0xFFFD;
    }

    /* deal with unrecognized or invalid entities */
    /* #433012 - fix by Randy Waki 17 Feb 01 */
    /* report invalid NCR's - Terry Teague 01 Sep 01 */
    if ( !found || (ch >= 128 && ch <= 159) || (ch >= 256 && c != ';') )
    {
        /* set error position just before offending character */
        SetLexerLocus( doc, lexer );
        lexer->columns = startcol;

        if (lexer->lexsize > start + 1)
        {
            if (ch >= 128 && ch <= 159)
            {
                /* invalid numeric character reference */
                
                uint c1 = 0;
                int replaceMode = DISCARDED_CHAR;
            
                /* Always assume Win1252 in this circumstance. */
                c1 = TY_(DecodeWin1252)( ch );

                if ( c1 )
                    replaceMode = REPLACED_CHAR;
                
                if ( c != ';' )  /* issue warning if not terminated by ';' */
                    TY_(ReportEntityError)( doc, MISSING_SEMICOLON_NCR,
                                            lexer->lexbuf+start, c );
 
                TY_(ReportEncodingError)(doc, INVALID_NCR, ch, replaceMode == DISCARDED_CHAR);
                
                if ( c1 )
                {
                    /* make the replacement */
                    lexer->lexsize = start;
                    TY_(AddCharToLexer)( lexer, c1 );
                    semicolon = no;
                }
                else
                {
                    /* discard */
                    lexer->lexsize = start;
                    semicolon = no;
               }
               
            }
            else
                TY_(ReportEntityError)( doc, UNKNOWN_ENTITY,
                                        lexer->lexbuf+start, ch );

            if (semicolon)
                TY_(AddCharToLexer)( lexer, ';' );
        }
        else
        {
            /*\ 
             *  Issue #207 - A naked & is allowed in HTML5, as an unambiguous ampersand!
            \*/
            if (TY_(HTMLVersion)(doc) != HT50) 
            {
                TY_(ReportEntityError)( doc, UNESCAPED_AMPERSAND,
                                    lexer->lexbuf+start, ch );
            }
        }
    }
    else
    {
        if ( c != ';' )    /* issue warning if not terminated by ';' */
        {
            /* set error position just before offending character */
            SetLexerLocus( doc, lexer );
            lexer->columns = startcol;
            TY_(ReportEntityError)( doc, MISSING_SEMICOLON, lexer->lexbuf+start, c );
        }

        if (preserveEntities)
            TY_(AddCharToLexer)( lexer, ';' );
        else
        {
            lexer->lexsize = start;
            if ( ch == 160 && (mode == Preformatted) )
                ch = ' ';
            TY_(AddCharToLexer)( lexer, ch );

            if ( ch == '&' && !cfgBool(doc, TidyQuoteAmpersand) )
                AddStringToLexer( lexer, "amp;" );
        }

        /* Detect extended vs. basic entities */
        TY_(ConstrainVersion)( doc, entver );
    }
}